

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

bool __thiscall anon_unknown.dwarf_27de14::PeerManagerImpl::CanDirectFetch(PeerManagerImpl *this)

{
  uint uVar1;
  long lVar2;
  Chainstate *pCVar3;
  time_point tVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = ChainstateManager::ActiveChainstate(this->m_chainman);
  uVar1 = (pCVar3->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]->nTime;
  tVar4 = NodeClock::now();
  lVar6 = (this->m_chainparams->consensus).nPowTargetSpacing * -20000000000 + (long)tVar4.__d.__r;
  lVar5 = (ulong)uVar1 * 1000000000;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return lVar5 - lVar6 != 0 && lVar6 <= lVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::CanDirectFetch()
{
    return m_chainman.ActiveChain().Tip()->Time() > NodeClock::now() - m_chainparams.GetConsensus().PowTargetSpacing() * 20;
}